

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_validate_archive(mz_zip_archive *pZip,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  int iVar3;
  mz_uint file_index;
  mz_uint32 found_index;
  mz_zip_archive_file_stat stat;
  mz_uint local_48c;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    return 0;
  }
  if (pmVar1->m_zip64 == 0) {
    if ((0xffff < pZip->m_total_files) || (*(int *)((long)&pZip->m_archive_size + 4) != 0))
    goto LAB_00109859;
  }
  else if ((pZip->m_total_files == 0xffffffff) || (0xfffffffe < (pmVar1->m_central_dir).m_size)) {
LAB_00109859:
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  if (pZip->m_total_files != 0) {
    file_index = 0;
    do {
      if ((flags >> 0xc & 1) != 0) {
        mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_488);
        if (mVar2 == 0) {
          return 0;
        }
        iVar3 = mz_zip_reader_locate_file_v2(pZip,local_488.m_filename,(char *)0x0,0,&local_48c);
        if (iVar3 == 0) {
          return 0;
        }
        if (file_index != local_48c) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
      }
      mVar2 = mz_zip_validate_file(pZip,file_index,flags);
      if (mVar2 == 0) {
        return 0;
      }
      file_index = file_index + 1;
    } while (file_index < pZip->m_total_files);
  }
  return 1;
}

Assistant:

mz_bool mz_zip_validate_archive(mz_zip_archive *pZip, mz_uint flags)
{
    mz_zip_internal_state *pState;
    uint32_t i;

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Basic sanity checks */
    if (!pState->m_zip64)
    {
        if (pZip->m_total_files > MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (pZip->m_archive_size > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }
    else
    {
        if (pZip->m_total_files >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    for (i = 0; i < pZip->m_total_files; i++)
    {
        if (MZ_ZIP_FLAG_VALIDATE_LOCATE_FILE_FLAG & flags)
        {
            mz_uint32 found_index;
            mz_zip_archive_file_stat stat;

            if (!mz_zip_reader_file_stat(pZip, i, &stat))
                return MZ_FALSE;

            if (!mz_zip_reader_locate_file_v2(pZip, stat.m_filename, NULL, 0, &found_index))
                return MZ_FALSE;

            /* This check can fail if there are duplicate filenames in the archive (which we don't check for when writing - that's up to the user) */
            if (found_index != i)
                return mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
        }

        if (!mz_zip_validate_file(pZip, i, flags))
            return MZ_FALSE;
    }

    return MZ_TRUE;
}